

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_realpath(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  char *__name;
  char *pcVar1;
  int *piVar2;
  int err;
  JSValue JVar3;
  char buf [4096];
  char local_1028 [4104];
  
  err = 0;
  __name = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  if (__name == (char *)0x0) {
    JVar3 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    pcVar1 = realpath(__name,local_1028);
    JS_FreeCString(ctx,__name);
    if (pcVar1 == (char *)0x0) {
      local_1028[0] = '\0';
      piVar2 = __errno_location();
      err = *piVar2;
    }
    JVar3 = JS_NewString(ctx,local_1028);
    JVar3 = make_obj_error(ctx,JVar3,err);
  }
  return JVar3;
}

Assistant:

static JSValue js_os_realpath(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    const char *path;
    char buf[PATH_MAX], *res;
    int err;

    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
    res = realpath(path, buf);
    JS_FreeCString(ctx, path);
    if (!res) {
        buf[0] = '\0';
        err = errno;
    } else {
        err = 0;
    }
    return make_string_error(ctx, buf, err);
}